

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void joystick_callback(int joy,int event)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  uint local_18;
  uint local_14;
  int buttonCount;
  int axisCount;
  int event_local;
  int joy_local;
  
  uVar1 = counter;
  buttonCount = event;
  axisCount = joy;
  if (event == 0x40001) {
    glfwGetJoystickAxes(joy,(int *)&local_14);
    glfwGetJoystickButtons(axisCount,(int *)&local_18);
    uVar1 = counter;
    counter = counter + 1;
    dVar4 = glfwGetTime();
    iVar2 = axisCount;
    pcVar3 = glfwGetJoystickName(axisCount);
    printf("%08x at %0.3f: Joystick %i (%s) was connected with %i axes and %i buttons\n",dVar4,
           (ulong)uVar1,(ulong)(uint)iVar2,pcVar3,(ulong)local_14,(ulong)local_18);
  }
  else {
    counter = counter + 1;
    glfwGetTime();
    printf("%08x at %0.3f: Joystick %i was disconnected\n",(ulong)uVar1,(ulong)(uint)axisCount);
  }
  return;
}

Assistant:

static void joystick_callback(int joy, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int axisCount, buttonCount;

        glfwGetJoystickAxes(joy, &axisCount);
        glfwGetJoystickButtons(joy, &buttonCount);

        printf("%08x at %0.3f: Joystick %i (%s) was connected with %i axes and %i buttons\n",
               counter++, glfwGetTime(),
               joy,
               glfwGetJoystickName(joy),
               axisCount,
               buttonCount);
    }
    else
    {
        printf("%08x at %0.3f: Joystick %i was disconnected\n",
               counter++, glfwGetTime(), joy);
    }
}